

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_do(Curl_easy *data,_Bool *done)

{
  curl_mimepart *part;
  uint *puVar1;
  IMAP *pIVar2;
  connectdata *conn;
  FILEPROTO *pFVar3;
  connectdata *pcVar4;
  bool bVar5;
  imapstate iVar6;
  _Bool *p_Var7;
  _Bool _Var8;
  char cVar9;
  CURLcode CVar10;
  int iVar11;
  char *pcVar12;
  size_t sVar13;
  long lVar14;
  char *pcVar15;
  char *pcVar16;
  char *value;
  char *name;
  size_t local_48;
  _Bool *local_40;
  Curl_easy *local_38;
  
  *done = false;
  pIVar2 = (data->req).p.imap;
  pcVar16 = (data->state).up.path;
  lVar14 = 1;
  pcVar12 = pcVar16;
  local_40 = done;
  do {
    pcVar15 = pcVar12;
    pcVar12 = pcVar15 + 1;
    _Var8 = imap_is_bchar(pcVar15[1]);
    lVar14 = lVar14 + -1;
  } while (_Var8);
  if (lVar14 == 0) {
    pIVar2->mailbox = (char *)0x0;
  }
  else {
    pcVar16 = pcVar16 + 1;
    if (*pcVar15 != '/') {
      pcVar15 = pcVar12;
    }
    CVar10 = Curl_urldecode(pcVar16,(long)pcVar15 - (long)pcVar16,&pIVar2->mailbox,(size_t *)0x0,
                            REJECT_CTRL);
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
  }
  while (cVar9 = *pcVar12, cVar9 == ';') {
    pcVar16 = pcVar12 + 1;
    pcVar15 = pcVar12 + 2;
    sVar13 = 0;
    pcVar12 = pcVar16;
    while( true ) {
      if (pcVar15[-1] == '\0') {
        return CURLE_URL_MALFORMAT;
      }
      if (pcVar15[-1] == '=') break;
      pcVar15 = pcVar15 + 1;
      sVar13 = sVar13 + 1;
      pcVar12 = pcVar12 + 1;
    }
    local_38 = data;
    CVar10 = Curl_urldecode(pcVar16,sVar13,&name,(size_t *)0x0,REJECT_CTRL);
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
    sVar13 = 0xffffffffffffffff;
    do {
      pcVar16 = pcVar12 + 1;
      pcVar12 = pcVar12 + 1;
      _Var8 = imap_is_bchar(*pcVar16);
      sVar13 = sVar13 + 1;
    } while (_Var8);
    CVar10 = Curl_urldecode(pcVar15,sVar13,&value,&local_48,REJECT_CTRL);
    if (CVar10 != CURLE_OK) {
      (*Curl_cfree)(name);
      return CVar10;
    }
    iVar11 = curl_strequal(name,"UIDVALIDITY");
    if ((iVar11 == 0) || (pIVar2->uidvalidity != (char *)0x0)) {
      iVar11 = curl_strequal(name,"UID");
      if ((iVar11 == 0) || (pIVar2->uid != (char *)0x0)) {
        iVar11 = curl_strequal(name,"MAILINDEX");
        if ((iVar11 == 0) || (pIVar2->mindex != (char *)0x0)) {
          iVar11 = curl_strequal(name,"SECTION");
          if ((iVar11 == 0) || (pIVar2->section != (char *)0x0)) {
            iVar11 = curl_strequal(name,"PARTIAL");
            if ((iVar11 == 0) || (pIVar2->partial != (char *)0x0)) {
              (*Curl_cfree)(name);
              (*Curl_cfree)(value);
              return CURLE_URL_MALFORMAT;
            }
            if ((local_48 != 0) && (value[local_48 - 1] == '/')) {
              value[local_48 - 1] = '\0';
            }
            pIVar2->partial = value;
          }
          else {
            if ((local_48 != 0) && (value[local_48 - 1] == '/')) {
              value[local_48 - 1] = '\0';
            }
            pIVar2->section = value;
          }
        }
        else {
          if ((local_48 != 0) && (value[local_48 - 1] == '/')) {
            value[local_48 - 1] = '\0';
          }
          pIVar2->mindex = value;
        }
      }
      else {
        if ((local_48 != 0) && (value[local_48 - 1] == '/')) {
          value[local_48 - 1] = '\0';
        }
        pIVar2->uid = value;
      }
    }
    else {
      if ((local_48 != 0) && (value[local_48 - 1] == '/')) {
        value[local_48 - 1] = '\0';
      }
      pIVar2->uidvalidity = value;
    }
    value = (char *)0x0;
    (*Curl_cfree)(name);
    (*Curl_cfree)(value);
    data = local_38;
  }
  if (((pIVar2->mailbox != (char *)0x0) && (pIVar2->uid == (char *)0x0)) &&
     (pIVar2->mindex == (char *)0x0)) {
    curl_url_get((data->state).uh,CURLUPART_QUERY,&pIVar2->query,0x40);
    cVar9 = *pcVar12;
  }
  if (cVar9 != '\0') {
    return CURLE_URL_MALFORMAT;
  }
  pcVar16 = (data->set).str[0x1c];
  if (pcVar16 != (char *)0x0) {
    pIVar2 = (data->req).p.imap;
    CVar10 = Curl_urldecode(pcVar16,0,&pIVar2->custom,(size_t *)0x0,REJECT_CTRL);
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
    pcVar16 = pIVar2->custom;
    pcVar12 = pcVar16;
    for (; *pcVar16 != '\0'; pcVar16 = pcVar16 + 1) {
      if (*pcVar16 == ' ') {
        pcVar16 = (*Curl_cstrdup)(pcVar16);
        pIVar2->custom_params = pcVar16;
        *pcVar12 = '\0';
        if (pIVar2->custom_params == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        break;
      }
      pcVar12 = pcVar12 + 1;
    }
  }
  (data->req).size = -1;
  Curl_pgrsSetUploadCounter(data,0);
  Curl_pgrsSetDownloadCounter(data,0);
  Curl_pgrsSetUploadSize(data,-1);
  Curl_pgrsSetDownloadSize(data,-1);
  conn = data->conn;
  pIVar2 = (data->req).p.imap;
  if (((data->req).field_0xdb & 2) != 0) {
    pIVar2->transfer = PPTRANSFER_INFO;
  }
  *local_40 = false;
  if ((((pIVar2->mailbox == (char *)0x0) ||
       (pcVar16 = (conn->proto).imapc.mailbox, pcVar16 == (char *)0x0)) ||
      (iVar11 = curl_strequal(pIVar2->mailbox,pcVar16), iVar11 == 0)) ||
     (((pIVar2->uidvalidity != (char *)0x0 &&
       (pcVar16 = (conn->proto).ftpc.server_os, pcVar16 != (char *)0x0)) &&
      (iVar11 = curl_strequal(pIVar2->uidvalidity,pcVar16), iVar11 == 0)))) {
    bVar5 = false;
  }
  else {
    bVar5 = true;
  }
  if ((((data->state).field_0x776 & 2) != 0) || ((data->set).mimepost.kind != MIMEKIND_NONE)) {
    pFVar3 = (data->req).p.file;
    if (pFVar3->freepath == (char *)0x0) {
      pcVar16 = "Cannot APPEND without a mailbox.";
      goto LAB_00138eb8;
    }
    if ((data->set).mimepost.kind == MIMEKIND_NONE) {
      CVar10 = Curl_creader_set_fread(data,(data->state).infilesize);
      if (CVar10 != CURLE_OK) {
        return CVar10;
      }
      lVar14 = (data->state).infilesize;
    }
    else {
      part = &(data->set).mimepost;
      puVar1 = &(data->set).mimepost.flags;
      *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
      curl_mime_headers(part,(data->set).headers,0);
      CVar10 = Curl_mime_prepare_headers(data,part,(char *)0x0,(char *)0x0,MIMESTRATEGY_MAIL);
      if (CVar10 != CURLE_OK) {
        return CVar10;
      }
      pcVar16 = Curl_checkheaders(data,"Mime-Version",0xc);
      if ((pcVar16 == (char *)0x0) &&
         (CVar10 = Curl_mime_add_header(&(data->set).mimepost.curlheaders,"Mime-Version: 1.0"),
         CVar10 != CURLE_OK)) {
        return CVar10;
      }
      CVar10 = Curl_creader_set_mime(data,part);
      if (CVar10 != CURLE_OK) {
        return CVar10;
      }
      lVar14 = Curl_creader_client_length(data);
      (data->state).infilesize = lVar14;
    }
    if (lVar14 < 0) {
      Curl_failf(data,"Cannot APPEND with unknown input file size");
      return CURLE_UPLOAD_FAILED;
    }
    pcVar16 = imap_atom(pFVar3->freepath,false);
    if (pcVar16 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar10 = imap_sendf(data,"APPEND %s (\\Seen) {%ld}",pcVar16,(data->state).infilesize);
    (*Curl_cfree)(pcVar16);
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
    iVar6 = IMAP_APPEND;
LAB_0013905f:
    (data->conn->proto).imapc.state = iVar6;
    goto LAB_0013909c;
  }
  if (pIVar2->custom == (char *)0x0) {
    if (!bVar5) {
      if (pIVar2->mailbox != (char *)0x0) {
        if ((pIVar2->uid == (char *)0x0) && (pIVar2->mindex == (char *)0x0)) {
          pcVar16 = pIVar2->query;
          goto joined_r0x00138fd9;
        }
        goto LAB_00138fdf;
      }
      goto LAB_00139089;
    }
    if ((pIVar2->uid == (char *)0x0) && (pIVar2->mindex == (char *)0x0)) {
      if (pIVar2->query == (char *)0x0) goto LAB_00139089;
      CVar10 = imap_perform_search(data);
    }
    else {
      CVar10 = imap_perform_fetch(data);
    }
  }
  else {
    if (!bVar5) {
      pcVar16 = pIVar2->mailbox;
joined_r0x00138fd9:
      if (pcVar16 != (char *)0x0) {
LAB_00138fdf:
        pcVar4 = data->conn;
        pFVar3 = (data->req).p.file;
        (*Curl_cfree)((pcVar4->proto).imapc.mailbox);
        (pcVar4->proto).ftpc.retr_size_saved = 0;
        (*Curl_cfree)((pcVar4->proto).ftpc.server_os);
        (pcVar4->proto).ftpc.server_os = (char *)0x0;
        pcVar16 = pFVar3->freepath;
        if (pcVar16 == (char *)0x0) {
          pcVar16 = "Cannot SELECT without a mailbox.";
LAB_00138eb8:
          Curl_failf(data,pcVar16);
          return CURLE_URL_MALFORMAT;
        }
        pcVar16 = imap_atom(pcVar16,false);
        if (pcVar16 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        CVar10 = imap_sendf(data,"SELECT %s",pcVar16);
        (*Curl_cfree)(pcVar16);
        if (CVar10 != CURLE_OK) {
          return CVar10;
        }
        iVar6 = IMAP_SELECT;
        goto LAB_0013905f;
      }
    }
LAB_00139089:
    CVar10 = imap_perform_list(data);
  }
  if (CVar10 != CURLE_OK) {
    return CVar10;
  }
LAB_0013909c:
  p_Var7 = local_40;
  CVar10 = imap_multi_statemach(data,local_40);
  _Var8 = false;
  Curl_conn_is_connected(conn,0);
  if ((CVar10 == CURLE_OK) && (CVar10 = CURLE_OK, *p_Var7 == true)) {
    imap_dophase_done(data,_Var8);
  }
  return CVar10;
}

Assistant:

static CURLcode imap_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  *done = FALSE; /* default to false */

  /* Parse the URL path */
  result = imap_parse_url_path(data);
  if(result)
    return result;

  /* Parse the custom request */
  result = imap_parse_custom_request(data);
  if(result)
    return result;

  result = imap_regular_transfer(data, done);

  return result;
}